

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O3

int CMConnection_set_character(CMConnection conn,attr_list attrs)

{
  CManager cm;
  int iVar1;
  
  cm = conn->cm;
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O3/thirdparty/EVPath/EVPath/cm_interface.c"
                   ,0x85);
  iVar1 = INT_CMConnection_set_character(conn,attrs);
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O3/thirdparty/EVPath/EVPath/cm_interface.c"
                     ,0x87);
  return iVar1;
}

Assistant:

extern int
CMConnection_set_character ( CMConnection conn, attr_list attrs )
{
	int ret;
	CManager cm = conn->cm;
	CManager_lock(cm);
	ret = INT_CMConnection_set_character(conn, attrs);
	CManager_unlock(cm);
	return ret;
}